

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O0

bool __thiscall Minimum<1>::propagate(Minimum<1> *this)

{
  bool bVar1;
  Lit *pLVar2;
  IntView<1> *this_00;
  int64_t iVar3;
  int64_t iVar4;
  long in_RDI;
  int i_2;
  Clause *r;
  int i_1;
  Clause *r_1;
  int64_t t;
  int i;
  int64_t m;
  Reason m_r;
  int64_t m_v;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  IntView<1> *in_stack_ffffffffffffff50;
  IntView<1> *in_stack_ffffffffffffff58;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff60;
  anon_union_8_2_743a5d44_for_Reason_0 r_00;
  long in_stack_ffffffffffffff68;
  char o;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff70;
  Reason local_78;
  int local_70;
  int local_6c;
  Clause *local_68;
  Reason local_60;
  int local_58;
  int local_54;
  Clause *local_50;
  Tchar *local_48;
  int local_3c;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  int local_24;
  anon_union_8_2_743a5d44_for_Reason_0 local_20;
  int64_t local_18;
  
  local_18 = Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x48));
  bVar1 = IntView<1>::setMaxNotR
                    (in_stack_ffffffffffffff50,
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (bVar1) {
    Reason::Reason((Reason *)&local_20,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      Tint::operator_cast_to_int((Tint *)(in_RDI + 0x40));
      local_24 = (int)IntView<1>::getMaxLit
                                ((IntView<1> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      Reason::Reason((Reason *)in_stack_ffffffffffffff58,
                     (Lit)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    local_30 = local_20;
    bVar1 = IntView<1>::setMax(in_stack_ffffffffffffff58,(int64_t)in_stack_ffffffffffffff50,
                               (Reason)in_stack_ffffffffffffff60,
                               SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0));
    if (!bVar1) {
      return false;
    }
  }
  o = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    local_38 = (anon_union_8_2_743a5d44_for_Reason_0)0x7fffffffffffffff;
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x20); local_3c = local_3c + 1) {
      local_48 = (Tchar *)IntView<1>::getMin(in_stack_ffffffffffffff50);
      if ((long)local_48 < (long)local_38) {
        local_38 = (anon_union_8_2_743a5d44_for_Reason_0)local_48;
      }
    }
    bVar1 = IntView<1>::setMinNotR
                      (in_stack_ffffffffffffff50,
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (bVar1) {
      local_50 = (Clause *)0x0;
      if ((so.lazy & 1U) != 0) {
        local_50 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x20); local_54 = local_54 + 1) {
          local_58 = (int)IntView<1>::getFMinLit
                                    ((IntView<1> *)
                                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                     0x1a1a0f);
          pLVar2 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
          ;
          pLVar2->x = local_58;
        }
      }
      in_stack_ffffffffffffff68 = in_RDI + 0x30;
      in_stack_ffffffffffffff70 = local_38;
      Reason::Reason(&local_60,local_50);
      bVar1 = IntView<1>::setMin(in_stack_ffffffffffffff58,(int64_t)in_stack_ffffffffffffff50,
                                 (Reason)in_stack_ffffffffffffff60,
                                 SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    local_38._a = IntView<1>::getMin(in_stack_ffffffffffffff50);
    local_68 = (Clause *)0x0;
    if ((so.lazy & 1U) != 0) {
      local_68 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      local_6c = (int)IntView<1>::getMinLit
                                ((IntView<1> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pLVar2 = Clause::operator[]((Clause *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pLVar2->x = local_6c;
    }
    for (local_70 = 0; o = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38),
        local_70 < *(int *)(in_RDI + 0x20); local_70 = local_70 + 1) {
      bVar1 = IntView<1>::setMinNotR
                        (in_stack_ffffffffffffff50,
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (bVar1) {
        this_00 = (IntView<1> *)(*(long *)(in_RDI + 0x28) + (long)local_70 * 0x10);
        r_00 = local_38;
        Reason::Reason(&local_78,local_68);
        bVar1 = IntView<1>::setMin(this_00,(int64_t)in_stack_ffffffffffffff50,(Reason)r_00,
                                   SUB41((uint)in_stack_ffffffffffffff4c >> 0x18,0));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
    }
  }
  iVar3 = IntView<1>::getMin(in_stack_ffffffffffffff50);
  iVar4 = Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x48));
  if (iVar3 == iVar4) {
    Tchar::operator=((Tchar *)in_stack_ffffffffffffff70._pt,o);
  }
  return true;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(x_i))
		setDom(y, setMax, min_max, x[min_max_var].getMaxLit());

		if (lower_change) {
			// make a greater than or equal to min(min(b_i))
			int64_t m = INT64_MAX;
			for (int i = 0; i < sz; i++) {
				const int64_t t = x[i].getMin();
				if (t < m) {
					m = t;
				}
			}
			if (y.setMinNotR(m)) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(sz + 1);
					// Finesse lower bounds
					// Add reason ![y <= m-1] \/ [x_1 <= m-1] \/ ... \/ [x_n <= m-1]
					for (int i = 0; i < sz; i++) {
						(*r)[i + 1] = x[i].getFMinLit(m);
					}
					//					for (int i = 0; i < sz; i++) (*r)[i+1] = x[i].getLit(m-1, LR_LE);
				}
				if (!y.setMin(m, r)) {
					return false;
				}
			}

			// make b_i greater than or equal to min(a)
			m = y.getMin();
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = y.getMinLit();
			}
			for (int i = 0; i < sz; i++) {
				if (x[i].setMinNotR(m)) {
					if (!x[i].setMin(m, r)) {
						return false;
					}
				}
			}
		}

		// Necessary and sufficient conditions for redundancy

		if (y.getMin() == min_max) {
			satisfied = true;
		}

		return true;
	}